

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeepsMD.cpp
# Opt level: O3

void __thiscall PeepsMD::ProcessImplicitRegs(PeepsMD *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  RegNum reg;
  Peeps *pPVar7;
  
  bVar4 = LowererMD::IsCall(instr);
  if (bVar4) {
    Peeps::ClearReg(this->peeps,RegRAX);
    Peeps::ClearReg(this->peeps,RegArg3);
    Peeps::ClearReg(this->peeps,RegArg2);
    Peeps::ClearReg(this->peeps,RegArg1);
    Peeps::ClearReg(this->peeps,RegArg0);
    Peeps::ClearReg(this->peeps,RegArg4);
    Peeps::ClearReg(this->peeps,RegArg5);
    Peeps::ClearReg(this->peeps,RegR10);
    Peeps::ClearReg(this->peeps,RegR11);
    Peeps::ClearReg(this->peeps,RegXMM0);
    Peeps::ClearReg(this->peeps,RegXMM1);
    Peeps::ClearReg(this->peeps,RegXMM2);
    Peeps::ClearReg(this->peeps,RegXMM3);
    Peeps::ClearReg(this->peeps,RegXMM4);
    Peeps::ClearReg(this->peeps,RegXMM5);
    Peeps::ClearReg(this->peeps,RegXMM6);
    Peeps::ClearReg(this->peeps,RegXMM7);
    Peeps::ClearReg(this->peeps,RegXMM8);
    Peeps::ClearReg(this->peeps,RegXMM9);
    Peeps::ClearReg(this->peeps,RegXMM10);
    Peeps::ClearReg(this->peeps,RegXMM11);
    Peeps::ClearReg(this->peeps,RegXMM12);
    Peeps::ClearReg(this->peeps,RegXMM13);
    Peeps::ClearReg(this->peeps,RegXMM14);
    pPVar7 = this->peeps;
    reg = RegXMM15;
  }
  else {
    OVar1 = instr->m_opcode;
    if (OVar1 < IMUL) {
      if ((OVar1 != DIV) && (OVar1 != IDIV)) {
        return;
      }
      pOVar2 = instr->m_dst;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_0064b978;
        *puVar6 = 0;
      }
      if (*(byte *)((long)&pOVar2[1].m_valueType.field_0.bits + 1) == 3) {
        pPVar7 = this->peeps;
        reg = RegRAX;
        goto LAB_0064b965;
      }
      pOVar2 = instr->m_dst;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_0064b978;
        *puVar6 = 0;
      }
      if (*(byte *)((long)&pOVar2[1].m_valueType.field_0.bits + 1) != 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PeepsMD.cpp"
                           ,0x28,"(instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX)",
                           "instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX");
        if (!bVar4) {
LAB_0064b978:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
    }
    else {
      if (OVar1 == XCHG) {
        OVar5 = IR::Opnd::GetKind(instr->m_src1);
        if (OVar5 == OpndKindReg) {
          pPVar7 = this->peeps;
          pOVar2 = instr->m_src1;
          OVar5 = IR::Opnd::GetKind(pOVar2);
          if (OVar5 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar4) goto LAB_0064b978;
            *puVar6 = 0;
          }
          Peeps::ClearReg(pPVar7,*(RegNum *)((long)&pOVar2[1].m_valueType.field_0.bits + 1));
        }
        OVar5 = IR::Opnd::GetKind(instr->m_src2);
        if (OVar5 != OpndKindReg) {
          return;
        }
        pPVar7 = this->peeps;
        pOVar2 = instr->m_src2;
        OVar5 = IR::Opnd::GetKind(pOVar2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_0064b978;
          *puVar6 = 0;
        }
        reg = *(RegNum *)((long)&pOVar2[1].m_valueType.field_0.bits + 1);
        goto LAB_0064b965;
      }
      if (OVar1 != IMUL) {
        return;
      }
    }
    pPVar7 = this->peeps;
    reg = RegArg2;
  }
LAB_0064b965:
  Peeps::ClearReg(pPVar7,reg);
  return;
}

Assistant:

void
PeepsMD::ProcessImplicitRegs(IR::Instr *instr)
{
    if (LowererMD::IsCall(instr))
    {
#define REGDAT(Name, Listing, Encode, Type, BitVec) \
        if (!((BitVec) & (RA_CALLEESAVE | RA_DONTALLOCATE))) \
        { \
            this->peeps->ClearReg(Reg ## Name); \
        }
#include "RegList.h"
    }
    else if (instr->m_opcode == Js::OpCode::IMUL)
    {
        this->peeps->ClearReg(RegRDX);
    }
    else if (instr->m_opcode == Js::OpCode::IDIV || instr->m_opcode == Js::OpCode::DIV)
    {
        if (instr->GetDst()->AsRegOpnd()->GetReg() == RegRDX)
        {
            this->peeps->ClearReg(RegRAX);
        }
        else
        {
            Assert(instr->GetDst()->AsRegOpnd()->GetReg() == RegRAX);
            this->peeps->ClearReg(RegRDX);
        }
    }
    else if (instr->m_opcode == Js::OpCode::XCHG)
    {
        // At time of writing, I believe that src1 is always identical to dst, but clear both for robustness.

        // Either of XCHG's operands (but not both) can be a memory address, so only clear registers.
        if (instr->GetSrc1()->IsRegOpnd())
        {
            this->peeps->ClearReg(instr->GetSrc1()->AsRegOpnd()->GetReg());
        }
        if (instr->GetSrc2()->IsRegOpnd())
        {
            this->peeps->ClearReg(instr->GetSrc2()->AsRegOpnd()->GetReg());
        }
    }
}